

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_parse_result * __thiscall
pugi::xml_node::append_buffer
          (xml_node *this,void *contents,size_t size,uint options,xml_encoding encoding)

{
  bool bVar1;
  xml_node_type parent;
  xml_document_struct *pxVar2;
  xml_extra_buffer *pxVar3;
  char_t **in_RCX;
  xml_node *in_RSI;
  xml_parse_result *in_RDI;
  name_null_sentry sentry;
  xml_extra_buffer *extra;
  xml_memory_page *page;
  xml_document_struct *doc;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  size_t in_stack_ffffffffffffff80;
  xml_allocator *in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffffa8;
  void *in_stack_ffffffffffffffb0;
  xml_node_struct *in_stack_ffffffffffffffb8;
  xml_document_struct *in_stack_ffffffffffffffc0;
  xml_encoding encoding_00;
  
  parent = type(in_RSI);
  bVar1 = impl::anon_unknown_0::allow_insert_child(parent,node_element);
  if (bVar1) {
    pxVar2 = impl::anon_unknown_0::get_document<pugi::xml_node_struct>(in_RSI->_root);
    (pxVar2->super_xml_node_struct).header = (pxVar2->super_xml_node_struct).header | 0x40;
    encoding_00 = encoding_auto;
    pxVar3 = (xml_extra_buffer *)
             impl::anon_unknown_0::xml_allocator::allocate_memory
                       (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                        (xml_memory_page **)
                        CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if (pxVar3 == (xml_extra_buffer *)0x0) {
      impl::anon_unknown_0::make_parse_result
                ((xml_parse_status)(in_stack_ffffffffffffff80 >> 0x20),
                 CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    }
    else {
      pxVar3->buffer = (char_t *)0x0;
      pxVar3->next = pxVar2->extra_buffers;
      pxVar2->extra_buffers = pxVar3;
      impl::anon_unknown_0::name_null_sentry::name_null_sentry
                ((name_null_sentry *)&stack0xffffffffffffffb8,in_RSI->_root);
      impl::anon_unknown_0::load_buffer_impl
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                 in_stack_ffffffffffffffa8,(uint)((ulong)in_RSI >> 0x20),encoding_00,
                 SUB81((ulong)in_RSI >> 0x18,0),SUB81((ulong)in_RSI >> 0x10,0),in_RCX);
      impl::anon_unknown_0::name_null_sentry::~name_null_sentry
                ((name_null_sentry *)&stack0xffffffffffffffb8);
    }
  }
  else {
    impl::anon_unknown_0::make_parse_result
              ((xml_parse_status)(in_stack_ffffffffffffff80 >> 0x20),
               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  }
  return in_RDI;
}

Assistant:

PUGI__FN xml_parse_result xml_node::append_buffer(const void* contents, size_t size, unsigned int options, xml_encoding encoding)
	{
		// append_buffer is only valid for elements/documents
		if (!impl::allow_insert_child(type(), node_element)) return impl::make_parse_result(status_append_invalid_root);

		// get document node
		impl::xml_document_struct* doc = &impl::get_document(_root);

		// disable document_buffer_order optimization since in a document with multiple buffers comparing buffer pointers does not make sense
		doc->header |= impl::xml_memory_page_contents_shared_mask;

		// get extra buffer element (we'll store the document fragment buffer there so that we can deallocate it later)
		impl::xml_memory_page* page = 0;
		impl::xml_extra_buffer* extra = static_cast<impl::xml_extra_buffer*>(doc->allocate_memory(sizeof(impl::xml_extra_buffer) + sizeof(void*), page));
		(void)page;

		if (!extra) return impl::make_parse_result(status_out_of_memory);

	#ifdef PUGIXML_COMPACT
		// align the memory block to a pointer boundary; this is required for compact mode where memory allocations are only 4b aligned
		// note that this requires up to sizeof(void*)-1 additional memory, which the allocation above takes into account
		extra = reinterpret_cast<impl::xml_extra_buffer*>((reinterpret_cast<uintptr_t>(extra) + (sizeof(void*) - 1)) & ~(sizeof(void*) - 1));
	#endif

		// add extra buffer to the list
		extra->buffer = 0;
		extra->next = doc->extra_buffers;
		doc->extra_buffers = extra;

		// name of the root has to be NULL before parsing - otherwise closing node mismatches will not be detected at the top level
		impl::name_null_sentry sentry(_root);

		return impl::load_buffer_impl(doc, _root, const_cast<void*>(contents), size, options, encoding, false, false, &extra->buffer);
	}